

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac-sha1.c
# Opt level: O0

void hmac_sha1(uint8_t *key,size_t key_len,uint8_t *message,size_t message_len,uint8_t *digest)

{
  size_t local_198;
  int local_17c;
  byte local_178 [4];
  int i;
  uint8_t outer_pad [64];
  uint8_t inner_pad [64];
  uint8_t inner_digest [20];
  byte local_d8 [8];
  uint8_t fixed_key [64];
  undefined1 local_8c [8];
  sha1_ctx ctx;
  uint8_t *digest_local;
  size_t message_len_local;
  uint8_t *message_local;
  size_t key_len_local;
  uint8_t *key_local;
  
  ctx.buf._56_8_ = digest;
  memset(local_d8,0,0x40);
  if (key_len < 0x41) {
    local_198 = key_len;
    if (0x40 < key_len) {
      local_198 = 0x40;
    }
    memcpy(local_d8,key,local_198);
  }
  else {
    sha1_init((sha1_ctx *)local_8c);
    sha1_update((sha1_ctx *)local_8c,key,(uint32_t)key_len);
    sha1_finalise((sha1_ctx *)local_8c,local_d8);
  }
  for (local_17c = 0; local_17c < 0x40; local_17c = local_17c + 1) {
    outer_pad[(long)local_17c + 0x38] = local_d8[local_17c] ^ 0x36;
    local_178[local_17c] = local_d8[local_17c] ^ 0x5c;
  }
  sha1_init((sha1_ctx *)local_8c);
  sha1_update((sha1_ctx *)local_8c,outer_pad + 0x38,0x40);
  sha1_update((sha1_ctx *)local_8c,message,(uint32_t)message_len);
  sha1_finalise((sha1_ctx *)local_8c,inner_pad + 0x38);
  sha1_init((sha1_ctx *)local_8c);
  sha1_update((sha1_ctx *)local_8c,local_178,0x40);
  sha1_update((sha1_ctx *)local_8c,inner_pad + 0x38,0x14);
  sha1_finalise((sha1_ctx *)local_8c,(uint8_t *)ctx.buf._56_8_);
  return;
}

Assistant:

void hmac_sha1(const uint8_t *key, size_t key_len, const uint8_t *message,
               size_t message_len, uint8_t digest[20]) {
  struct sha1_ctx ctx;
  uint8_t fixed_key[64];
  uint8_t inner_digest[20];
  uint8_t inner_pad[64];
  uint8_t outer_pad[64];

  memset(fixed_key, 0, 64);
  if (key_len > 64) {
    sha1_init(&ctx);
    sha1_update(&ctx, (const uint8_t *)key, key_len);
    sha1_finalise(&ctx, fixed_key);
  } else {
    memcpy(fixed_key, key, key_len > 64 ? 64 : key_len);
  }

  for (int i = 0; i < 64; i++) {
    inner_pad[i] = fixed_key[i] ^ 0x36;
    outer_pad[i] = fixed_key[i] ^ 0x5c;
  }

  // perform inner hash
  sha1_init(&ctx);
  sha1_update(&ctx, inner_pad, 64);
  sha1_update(&ctx, message, message_len);
  sha1_finalise(&ctx, inner_digest);

  sha1_init(&ctx);
  sha1_update(&ctx, outer_pad, 64);
  sha1_update(&ctx, inner_digest, 20);
  sha1_finalise(&ctx, digest);
}